

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O1

void __thiscall duckdb_tdigest::TDigest::process(TDigest *this)

{
  pointer *ppCVar1;
  double dVar2;
  double dVar3;
  pointer pCVar4;
  pointer pCVar5;
  pointer pCVar6;
  iterator iVar7;
  long lVar8;
  Weight WVar9;
  ulong uVar10;
  Centroid *pCVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  Weight WVar16;
  Value VVar17;
  double dVar18;
  
  pCVar4 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar5 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar4 != pCVar5) {
    uVar10 = (long)pCVar5 - (long)pCVar4 >> 4;
    lVar8 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<duckdb_tdigest::Centroid*,std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb_tdigest::CentroidComparator>>
              (pCVar4,pCVar5,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<duckdb_tdigest::Centroid*,std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb_tdigest::CentroidComparator>>
              (pCVar4,pCVar5);
  }
  pCVar4 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pCVar5 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<duckdb_tdigest::Centroid_const*,std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>>>
            ((vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>> *)
             &this->unprocessed_,pCVar4,
             (this->processed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->processed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pCVar6 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::
  __inplace_merge<__gnu_cxx::__normal_iterator<duckdb_tdigest::Centroid*,std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb_tdigest::CentroidComparator>>
            (pCVar6,(long)pCVar4 + ((long)pCVar6 - (long)pCVar5),
             (this->unprocessed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  this->processedWeight_ = this->unprocessedWeight_ + this->processedWeight_;
  this->unprocessedWeight_ = 0.0;
  pCVar4 = (this->processed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->processed_).
      super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
      _M_impl.super__Vector_impl_data._M_finish != pCVar4) {
    (this->processed_).
    super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar4;
  }
  iVar7._M_current =
       (this->processed_).
       super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  pCVar11 = (this->unprocessed_).
            super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (iVar7._M_current ==
      (this->processed_).
      super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>::
    _M_realloc_insert<duckdb_tdigest::Centroid_const&>
              ((vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>> *)
               &this->processed_,iVar7,pCVar11);
  }
  else {
    WVar16 = pCVar11->weight_;
    (iVar7._M_current)->mean_ = pCVar11->mean_;
    (iVar7._M_current)->weight_ = WVar16;
    ppCVar1 = &(this->processed_).
               super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  WVar16 = ((this->unprocessed_).
            super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
            _M_impl.super__Vector_impl_data._M_start)->weight_;
  dVar2 = this->compression_;
  uVar13 = SUB84(dVar2,0);
  uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
  if (1.0 <= dVar2) {
    uVar13 = 0;
    uVar14 = 0x3ff00000;
  }
  dVar18 = this->processedWeight_;
  dVar2 = sin(((double)CONCAT44(uVar14,uVar13) * 3.141592653589793) / dVar2 + -1.5707963267948966);
  pCVar4 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pCVar11 = (this->unprocessed_).
            super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
            _M_impl.super__Vector_impl_data._M_start + 1;
  if (pCVar11 < pCVar4) {
    dVar18 = dVar18 * (dVar2 + 1.0) * 0.5;
    do {
      dVar2 = pCVar11->weight_;
      if (WVar16 + dVar2 <= dVar18) {
        pCVar5 = (this->processed_).
                 super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        dVar3 = pCVar5[-1].weight_;
        if ((dVar3 != 0.0) || (NAN(dVar3))) {
          pCVar5[-1].weight_ = dVar2 + dVar3;
          VVar17 = ((pCVar11->mean_ - pCVar5[-1].mean_) * pCVar11->weight_) / (dVar2 + dVar3) +
                   pCVar5[-1].mean_;
        }
        else {
          pCVar5[-1].weight_ = dVar2;
          VVar17 = pCVar11->mean_;
        }
        pCVar5[-1].mean_ = VVar17;
        WVar16 = WVar16 + dVar2;
      }
      else {
        dVar18 = WVar16 / this->processedWeight_;
        dVar2 = this->compression_;
        dVar15 = asin(dVar18 + dVar18 + -1.0);
        dVar3 = this->compression_;
        dVar18 = this->processedWeight_;
        dVar2 = ((dVar15 + 1.5707963267948966) * dVar2) / 3.141592653589793 + 1.0;
        dVar15 = dVar3;
        if (dVar2 <= dVar3) {
          dVar15 = dVar2;
        }
        dVar2 = sin((dVar15 * 3.141592653589793) / dVar3 + -1.5707963267948966);
        WVar16 = WVar16 + pCVar11->weight_;
        dVar18 = (dVar2 + 1.0) * 0.5 * dVar18;
        iVar7._M_current =
             (this->processed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->processed_).
            super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>::
          _M_realloc_insert<duckdb_tdigest::Centroid_const&>
                    ((vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>> *)
                     &this->processed_,iVar7,pCVar11);
        }
        else {
          WVar9 = pCVar11->weight_;
          (iVar7._M_current)->mean_ = pCVar11->mean_;
          (iVar7._M_current)->weight_ = WVar9;
          ppCVar1 = &(this->processed_).
                     super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
      }
      pCVar11 = pCVar11 + 1;
    } while (pCVar11 < pCVar4);
  }
  pCVar4 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->unprocessed_).
      super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
      _M_impl.super__Vector_impl_data._M_finish != pCVar4) {
    (this->unprocessed_).
    super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar4;
  }
  dVar2 = ((this->processed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start)->mean_;
  dVar18 = (this->processed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1].mean_;
  uVar10 = -(ulong)(dVar2 < this->min_);
  uVar12 = -(ulong)(this->max_ < dVar18);
  this->min_ = (Value)(~uVar10 & (ulong)this->min_ | (ulong)dVar2 & uVar10);
  this->max_ = (Value)(~uVar12 & (ulong)this->max_ | (ulong)dVar18 & uVar12);
  updateCumulative(this);
  return;
}

Assistant:

inline void process() {
		CentroidComparator cc;
		std::sort(unprocessed_.begin(), unprocessed_.end(), cc);
		auto count = unprocessed_.size();
		unprocessed_.insert(unprocessed_.end(), processed_.cbegin(), processed_.cend());
		std::inplace_merge(unprocessed_.begin(), unprocessed_.begin() + int64_t(count), unprocessed_.end(), cc);

		processedWeight_ += unprocessedWeight_;
		unprocessedWeight_ = 0;
		processed_.clear();

		processed_.push_back(unprocessed_[0]);
		Weight wSoFar = unprocessed_[0].weight();
		Weight wLimit = processedWeight_ * integratedQ(1.0);

		auto end = unprocessed_.end();
		for (auto iter = unprocessed_.cbegin() + 1; iter < end; iter++) {
			auto &centroid = *iter;
			Weight projectedW = wSoFar + centroid.weight();
			if (projectedW <= wLimit) {
				wSoFar = projectedW;
				(processed_.end() - 1)->add(centroid);
			} else {
				auto k1 = integratedLocation(wSoFar / processedWeight_);
				wLimit = processedWeight_ * integratedQ(k1 + 1.0);
				wSoFar += centroid.weight();
				processed_.emplace_back(centroid);
			}
		}
		unprocessed_.clear();
		min_ = std::min(min_, processed_[0].mean());
		max_ = std::max(max_, (processed_.cend() - 1)->mean());
		updateCumulative();
	}